

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::IGXMLScanner::commonInit(IGXMLScanner *this)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  XMLSize_t index;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RefVectorOf<xercesc_4_0::KVStringPair> *pRVar4;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_02;
  DTDValidator *this_00;
  SchemaValidator *this_01;
  IdentityConstraintHandler *this_02;
  ValueVectorOf<char16_t_*> *pVVar6;
  undefined4 extraout_var_03;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_03;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this_04;
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *pRVar7;
  undefined4 extraout_var_04;
  Hash2KeysSetOf<xercesc_4_0::StringHasher> *pHVar8;
  undefined4 extraout_var_05;
  PSVIAttributeList *this_05;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *pRVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  XMLSize_t XVar10;
  
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)this->fElemStateSize << 2);
  this->fElemState = (uint *)CONCAT44(extraout_var,iVar3);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)this->fElemStateSize << 2);
  this->fElemLoopState = (uint *)CONCAT44(extraout_var_00,iVar3);
  pRVar4 = (RefVectorOf<xercesc_4_0::KVStringPair> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_00415160;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fAdoptedElems = true;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fCurCount = 0;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fMaxCount = 0x20;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fElemList = (KVStringPair **)0x0;
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fMemoryManager = pMVar1;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x100);
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fElemList =
       (KVStringPair **)CONCAT44(extraout_var_01,iVar3);
  lVar5 = 0;
  do {
    (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>).fElemList[lVar5] =
         (KVStringPair *)0x0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x20);
  (pRVar4->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_004150e8;
  this->fRawAttrList = pRVar4;
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)this->fRawAttrColonListSize << 2);
  this->fRawAttrColonList = (int *)CONCAT44(extraout_var_02,iVar3);
  this_00 = (DTDValidator *)XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  DTDValidator::DTDValidator(this_00,(XMLErrorReporter *)0x0);
  this->fDTDValidator = this_00;
  XMLScanner::initValidator(&this->super_XMLScanner,(XMLValidator *)this_00);
  this_01 = (SchemaValidator *)XMemory::operator_new(0xd0,(this->super_XMLScanner).fMemoryManager);
  SchemaValidator::SchemaValidator
            (this_01,(XMLErrorReporter *)0x0,(this->super_XMLScanner).fMemoryManager);
  this->fSchemaValidator = this_01;
  XMLScanner::initValidator(&this->super_XMLScanner,(XMLValidator *)this_01);
  this_02 = (IdentityConstraintHandler *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  IdentityConstraintHandler::IdentityConstraintHandler
            (this_02,&this->super_XMLScanner,(this->super_XMLScanner).fMemoryManager);
  this->fICHandler = this_02;
  pVVar6 = (ValueVectorOf<char16_t_*> *)
           XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pVVar6->fCallDestructor = false;
  pVVar6->fCurCount = 0;
  pVVar6->fMaxCount = 8;
  pVVar6->fElemList = (char16_t **)0x0;
  pVVar6->fMemoryManager = pMVar1;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pVVar6->fElemList = (char16_t **)CONCAT44(extraout_var_03,iVar3);
  memset((char16_t **)CONCAT44(extraout_var_03,iVar3),0,pVVar6->fMaxCount << 3);
  this->fLocationPairs = pVVar6;
  this_03 = (NameIdPool<xercesc_4_0::DTDElementDecl> *)
            XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
  NameIdPool<xercesc_4_0::DTDElementDecl>::NameIdPool
            (this_03,0x1d,0x80,(this->super_XMLScanner).fMemoryManager);
  this->fDTDElemNonDeclPool = this_03;
  this_04 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x40,(this->super_XMLScanner).fMemoryManager);
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::RefHash3KeysIdPool
            (this_04,0x1d,true,0x80,(this->super_XMLScanner).fMemoryManager);
  this->fSchemaElemNonDeclPool = this_04;
  pRVar7 = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)
           XMemory::operator_new(0x38,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pRVar7->fMemoryManager = pMVar1;
  pRVar7->fAdoptedElems = false;
  pRVar7->fBucketList = (RefHashTableBucketElem<unsigned_int> **)0x0;
  pRVar7->fHashModulus = 0x83;
  pRVar7->fInitialModulus = 0x83;
  pRVar7->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x418);
  pRVar7->fBucketList = (RefHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_04,iVar3);
  XVar2 = pRVar7->fHashModulus;
  if (XVar2 != 0) {
    XVar10 = 0;
    do {
      pRVar7->fBucketList[XVar10] = (RefHashTableBucketElem<unsigned_int> *)0x0;
      XVar10 = XVar10 + 1;
    } while (XVar2 != XVar10);
  }
  this->fAttDefRegistry = pRVar7;
  pHVar8 = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pHVar8->fMemoryManager = pMVar1;
  pHVar8->fBucketList = (Hash2KeysSetBucketElem **)0x0;
  pHVar8->fHashModulus = 7;
  pHVar8->fCount = 0;
  pHVar8->fAvailable = (Hash2KeysSetBucketElem *)0x0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pHVar8->fBucketList = (Hash2KeysSetBucketElem **)CONCAT44(extraout_var_05,iVar3);
  memset((Hash2KeysSetBucketElem **)CONCAT44(extraout_var_05,iVar3),0,pHVar8->fHashModulus << 3);
  this->fUndeclaredAttrRegistry = pHVar8;
  this_05 = (PSVIAttributeList *)XMemory::operator_new(0x18,(this->super_XMLScanner).fMemoryManager)
  ;
  PSVIAttributeList::PSVIAttributeList(this_05,(this->super_XMLScanner).fMemoryManager);
  this->fPSVIAttrList = this_05;
  pRVar9 = (RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pRVar9->fMemoryManager = pMVar1;
  pRVar9->fAdoptedElems = true;
  pRVar9->fBucketList = (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> **)0x0;
  pRVar9->fHashModulus = 0x1d;
  pRVar9->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pRVar9->fBucketList =
       (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> **)CONCAT44(extraout_var_06,iVar3);
  memset((RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> **)CONCAT44(extraout_var_06,iVar3),0,
         pRVar9->fHashModulus << 3);
  this->fSchemaInfoList = pRVar9;
  pRVar9 = (RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pRVar9->fMemoryManager = pMVar1;
  pRVar9->fAdoptedElems = true;
  pRVar9->fBucketList = (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> **)0x0;
  pRVar9->fHashModulus = 0x1d;
  pRVar9->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pRVar9->fBucketList =
       (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> **)CONCAT44(extraout_var_07,iVar3);
  memset((RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> **)CONCAT44(extraout_var_07,iVar3),0,
         pRVar9->fHashModulus << 3);
  this->fCachedSchemaInfoList = pRVar9;
  if ((this->super_XMLScanner).fValidator == (XMLValidator *)0x0) {
    (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
  }
  return;
}

Assistant:

void IGXMLScanner::commonInit()
{

    //  Create the element state array
    fElemState = (unsigned int*) fMemoryManager->allocate
    (
        fElemStateSize * sizeof(unsigned int)
    ); //new unsigned int[fElemStateSize];
    fElemLoopState = (unsigned int*) fMemoryManager->allocate
    (
        fElemStateSize * sizeof(unsigned int)
    ); //new unsigned int[fElemStateSize];

    //  And we need one for the raw attribute scan. This just stores key/
    //  value string pairs (prior to any processing.)
    fRawAttrList = new (fMemoryManager) RefVectorOf<KVStringPair>(32, true, fMemoryManager);
    fRawAttrColonList = (int*) fMemoryManager->allocate
    (
        fRawAttrColonListSize * sizeof(int)
    );

    //  Create the Validator and init them
    fDTDValidator = new (fMemoryManager) DTDValidator();
    initValidator(fDTDValidator);
    fSchemaValidator = new (fMemoryManager) SchemaValidator(0, fMemoryManager);
    initValidator(fSchemaValidator);

    // Create IdentityConstraint info
    fICHandler = new (fMemoryManager) IdentityConstraintHandler(this, fMemoryManager);

    // Create schemaLocation pair info
    fLocationPairs = new (fMemoryManager) ValueVectorOf<XMLCh*>(8, fMemoryManager);
    // create pools for undeclared elements
    fDTDElemNonDeclPool = new (fMemoryManager) NameIdPool<DTDElementDecl>(29, 128, fMemoryManager);
    fSchemaElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
    fAttDefRegistry = new (fMemoryManager) RefHashTableOf<unsigned int, PtrHasher>
    (
        131, false, fMemoryManager
    );
    fUndeclaredAttrRegistry = new (fMemoryManager) Hash2KeysSetOf<StringHasher>(7, fMemoryManager);
    fPSVIAttrList = new (fMemoryManager) PSVIAttributeList(fMemoryManager);

    fSchemaInfoList = new (fMemoryManager) RefHash2KeysTableOf<SchemaInfo>(29, fMemoryManager);
    fCachedSchemaInfoList = new (fMemoryManager) RefHash2KeysTableOf<SchemaInfo>(29, fMemoryManager);

    // use fDTDValidator as the default validator
    if (!fValidator)
        fValidator = fDTDValidator;
}